

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_field.h
# Opt level: O0

pointer __thiscall
google::protobuf::RepeatedField<unsigned_int>::Add(RepeatedField<unsigned_int> *this)

{
  int iVar1;
  int iVar2;
  uint *puVar3;
  void *p;
  int old_size;
  bool is_soo;
  RepeatedField<unsigned_int> *this_local;
  
  p._7_1_ = RepeatedField<unsigned_int>::is_soo(this);
  iVar1 = size(this,p._7_1_);
  iVar2 = Capacity(this);
  if (iVar1 == iVar2) {
    Grow(this,p._7_1_,iVar1,iVar1 + 1);
    p._7_1_ = false;
  }
  puVar3 = unsafe_elements(this,p._7_1_);
  iVar1 = ExchangeCurrentSize(this,p._7_1_,iVar1 + 1);
  return puVar3 + iVar1;
}

Assistant:

inline Element* RepeatedField<Element>::Add() ABSL_ATTRIBUTE_LIFETIME_BOUND {
  bool is_soo = this->is_soo();
  const int old_size = size(is_soo);
  if (ABSL_PREDICT_FALSE(old_size == Capacity())) {
    Grow(is_soo, old_size, old_size + 1);
    is_soo = false;
  }
  void* p = unsafe_elements(is_soo) + ExchangeCurrentSize(is_soo, old_size + 1);
  return ::new (p) Element;
}